

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName)

{
  int iVar1;
  Wlc_Prs_t *p_00;
  Wlc_Ntk_t *local_28;
  Wlc_Ntk_t *pNtk;
  Wlc_Prs_t *p;
  char *pFileName_local;
  
  local_28 = (Wlc_Ntk_t *)0x0;
  p_00 = Wlc_PrsStart(pFileName);
  if (p_00 == (Wlc_Prs_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    iVar1 = Wlc_PrsPrepare(p_00);
    if ((iVar1 != 0) && (iVar1 = Wlc_PrsDerive(p_00), iVar1 != 0)) {
      local_28 = Wlc_NtkDupDfs(p_00->pNtk);
      Wlc_NtkTransferNames(local_28,p_00->pNtk);
    }
    Wlc_PrsPrintErrorMessage(p_00);
    Wlc_PrsStop(p_00);
    pFileName_local = (char *)local_28;
  }
  return (Wlc_Ntk_t *)pFileName_local;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // start the parser 
    p = Wlc_PrsStart( pFileName );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    pNtk = Wlc_NtkDupDfs( p->pNtk );
    Wlc_NtkTransferNames( pNtk, p->pNtk );
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}